

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O1

err_t cmdSigExtr(char *obj_name,char *sig_name,char *scope)

{
  bool bVar1;
  bool_t bVar2;
  int iVar3;
  err_t eVar4;
  u32 uVar5;
  cmd_sig_t *sig;
  size_t sVar6;
  size_t count;
  err_t eVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char *dec;
  octet *der;
  size_t sig_len;
  size_t local_38;
  
  bVar2 = strIsValid(sig_name);
  if (bVar2 == 0) {
    return 0x6d;
  }
  bVar2 = strIsValid(obj_name);
  if (bVar2 == 0) {
    return 0x6d;
  }
  bVar2 = strIsValid(scope);
  if (bVar2 == 0) {
    return 0x6d;
  }
  iVar3 = strCmp(scope,"body");
  if (((iVar3 != 0) && (iVar3 = strCmp(scope,"sig"), iVar3 != 0)) &&
     (bVar2 = strStartsWith(scope,"cert"), bVar2 == 0)) {
    return 0x25b;
  }
  sig = (cmd_sig_t *)blobCreate(0x630);
  if (sig == (cmd_sig_t *)0x0) {
    return 0x6e;
  }
  eVar4 = cmdSigRead(sig,&local_38,sig_name);
  if (eVar4 != 0) goto LAB_0010738c;
  bVar2 = strStartsWith(scope,"cert");
  if (bVar2 != 0) {
    sVar6 = strLen("cert");
    dec = scope + sVar6;
    bVar2 = decIsValid(dec);
    if ((bVar2 == 0) || (sVar6 = strLen(dec), sVar6 != 1)) {
      eVar7 = 0x25b;
      bVar1 = false;
    }
    else {
      eVar7 = 0;
      bVar1 = true;
    }
    if (bVar1) {
      uVar5 = decToU32(dec);
      uVar8 = (ulong)uVar5;
      sVar6 = sig->certs_len;
      der = sig->certs;
      uVar9 = 0;
      if (sVar6 == 0) {
        count = 0;
        uVar10 = 0;
      }
      else {
        do {
          count = btokCVCLen(der,sVar6);
          if (count == 0xffffffffffffffff) {
            count = 0xffffffffffffffff;
            uVar10 = uVar9;
            break;
          }
          uVar10 = uVar8;
          if (uVar8 == uVar9) break;
          der = der + count;
          uVar10 = uVar9 + 1;
          sVar6 = sVar6 - count;
          uVar9 = uVar10;
        } while (sVar6 != 0);
      }
      eVar4 = 0x202;
      if ((uVar10 == uVar8) && (count - 1 < 0xfffffffffffffffe)) {
        eVar4 = cmdFileWrite(obj_name,der,count);
      }
    }
    else {
      blobClose(sig);
      eVar4 = eVar7;
    }
    if (!bVar1) {
      return eVar7;
    }
    goto LAB_0010738c;
  }
  iVar3 = strCmp(scope,"body");
  sVar6 = cmdFileSize(sig_name);
  if (iVar3 == 0) {
    if (sVar6 == 0xffffffffffffffff) goto LAB_001074da;
    eVar4 = 0x132;
    local_38 = sVar6 - local_38;
    if (local_38 == 0) goto LAB_0010738c;
    sVar6 = 0;
  }
  else {
    if (sVar6 == 0xffffffffffffffff) {
LAB_001074da:
      eVar4 = 0xcf;
      goto LAB_0010738c;
    }
    sVar6 = sVar6 - local_38;
  }
  eVar4 = cmdFileDup(obj_name,sig_name,sVar6,local_38);
LAB_0010738c:
  blobClose(sig);
  return eVar4;
}

Assistant:

err_t cmdSigExtr(const char* obj_name, const char* sig_name, const char* scope)
{
	err_t code;
	void* stack;
	cmd_sig_t* sig;
	size_t sig_len;
	// входной контроль
	if (!strIsValid(sig_name) || !strIsValid(obj_name) || !strIsValid(scope))
		return ERR_BAD_INPUT;
	if (!strEq(scope, "body") &&
		!strEq(scope, "sig") &&
		!strStartsWith(scope, "cert"))
		return ERR_CMD_PARAMS;
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(cmd_sig_t));
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	// читать подпись
	code = cmdSigRead(sig, &sig_len, sig_name);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// извлечь сертификат?
	if (strStartsWith(scope, "cert"))
	{
		size_t num;
		size_t certs_len;
		const octet* cert;
		size_t cert_len;
		size_t pos;
		// определить номер сертификата
		scope += strLen("cert");
		if (!decIsValid(scope) || strLen(scope) != 1)
			code = ERR_CMD_PARAMS;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		num = decToU32(scope);
		// искать сертификат
		certs_len = sig->certs_len, cert = sig->certs, cert_len = pos = 0;
		while (certs_len)
		{
			cert_len = btokCVCLen(cert, certs_len);
			if (cert_len == SIZE_MAX || pos == num)
				break;
			certs_len -= cert_len, cert += cert_len, ++pos;
		}
		// найден? записать в файл
		if (pos == num && cert_len != 0 && cert_len != SIZE_MAX)
			code = cmdFileWrite(obj_name, cert, cert_len);
		else
			code = ERR_BAD_CERT;
	}
	else if (strEq(scope, "body"))
	{
		size_t size = cmdFileSize(sig_name);
		if (size == SIZE_MAX)
			code = ERR_FILE_READ;
		else if (size == sig_len)
			code = ERR_BAD_FORMAT;
		else
			code = cmdFileDup(obj_name, sig_name, 0, size - sig_len);
	}
	else
	{
		size_t size = cmdFileSize(sig_name);
		if (size == SIZE_MAX)
			code = ERR_FILE_READ;
		else
			code = cmdFileDup(obj_name, sig_name, size - sig_len, sig_len);
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}